

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  bool bVar1;
  bool bVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  QRect QVar15;
  QRectF r;
  QRectF local_58;
  QWidgetTextControl local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_01 = this_00->control;
  QWidgetTextControl::textCursor(local_30);
  local_58.w = -NAN;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp = -NAN;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_01,(QTextCursor *)local_30);
  dVar11 = 0.0;
  if (0.0 <= local_58.xp) {
    dVar11 = local_58.xp;
  }
  dVar11 = dVar11 - local_58.xp;
  local_58.xp = local_58.xp + dVar11;
  local_58.w = local_58.w - dVar11;
  QTextCursor::~QTextCursor((QTextCursor *)local_30);
  qVar5 = local_58.w;
  uVar10 = local_58.yp._4_4_;
  qVar4 = local_58.xp;
  dVar11 = (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
  dVar13 = (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
  LVar6 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar6 == RightToLeft) {
    iVar7 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar8 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    uVar9 = iVar7 - iVar8;
  }
  else {
    uVar9 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar3 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    dVar12 = (double)((ulong)qVar4 & 0x8000000000000000 | 0x3fe0000000000000) + qVar4;
    bVar1 = 2147483647.0 < dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    dVar12 = (double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar12);
    iVar7 = (int)dVar12;
    dVar12 = qVar5 + (qVar4 - (double)(int)dVar12) * 0.5;
    dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    bVar1 = 2147483647.0 < dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    dVar14 = (double)(((ulong)uVar10 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar11;
    bVar2 = 2147483647.0 < dVar14;
    if (dVar14 <= -2147483648.0) {
      dVar14 = -2147483648.0;
    }
    dVar14 = (double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar14);
    iVar8 = (int)dVar14;
    dVar13 = dVar13 + (dVar11 - (double)(int)dVar14) * 0.5;
    dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    bVar2 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    uVar10 = (uint)(qVar3 + this_00->topLineFracture);
    QVar15.x1.m_i = iVar7 - uVar9;
    QVar15.y1.m_i = iVar8 - uVar10;
    QVar15.y2.m_i =
         ~uVar10 + iVar8 +
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar13);
    QVar15.x2.m_i =
         ~uVar9 + iVar7 +
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar12);
    return QVar15;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect() const
{
    Q_D(const QPlainTextEdit);
    QRect r = d->control->cursorRect().toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}